

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glesv2_gears.c
# Opt level: O2

void draw_gear(gears_t_conflict1 *gears,int id,float model_tx,float model_ty,float model_rz,
              float *color)

{
  gear_conflict *pgVar1;
  ulong uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  char *pcVar10;
  long lVar11;
  float pos [4];
  float ModelViewProjection [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78 [12];
  uint uStack_48;
  uint uStack_44;
  uint local_40;
  undefined4 local_3c;
  
  pgVar1 = gears->gear[(uint)id];
  pos[0] = 5.0;
  pos[1] = 5.0;
  pos[2] = 10.0;
  pos[3] = 0.0;
  if (pgVar1 != (gear_conflict *)0x0) {
    iVar9 = (*gears->glGetUniformLocation)(gears->program,"u_LightPos");
    (*gears->glUniform4fv)(iVar9,1,pos);
    local_b8 = *(undefined8 *)gears->View;
    uStack_b0 = *(ulong *)(gears->View + 2);
    local_a8 = *(undefined8 *)(gears->View + 4);
    uStack_a0 = *(ulong *)(gears->View + 6);
    local_98 = *(ulong *)(gears->View + 8);
    uStack_90 = *(ulong *)(gears->View + 10);
    local_88 = *(undefined8 *)(gears->View + 0xc);
    uStack_80 = *(undefined8 *)(gears->View + 0xe);
    translate((float *)&local_b8,model_tx,model_ty,0.0);
    rotate((float *)&local_b8,model_rz,0.0,0.0,1.0);
    ModelViewProjection._0_8_ = *(undefined8 *)gears->Projection;
    ModelViewProjection._8_8_ = *(undefined8 *)(gears->Projection + 2);
    ModelViewProjection._16_8_ = *(undefined8 *)(gears->Projection + 4);
    ModelViewProjection._24_8_ = *(undefined8 *)(gears->Projection + 6);
    ModelViewProjection._32_8_ = *(undefined8 *)(gears->Projection + 8);
    ModelViewProjection._40_8_ = *(undefined8 *)(gears->Projection + 10);
    ModelViewProjection._48_8_ = *(undefined8 *)(gears->Projection + 0xc);
    ModelViewProjection._56_8_ = *(undefined8 *)(gears->Projection + 0xe);
    multiply(ModelViewProjection,(float *)&local_b8);
    iVar9 = (*gears->glGetUniformLocation)(gears->program,"u_ModelViewProjectionMatrix");
    (*gears->glUniformMatrix4fv)(iVar9,1,'\0',ModelViewProjection);
    uVar4 = uStack_b0;
    local_78[0] = 1.0;
    local_78[1] = 0.0;
    local_78[2] = 0.0;
    local_78[3] = 0.0;
    local_78[4] = 0.0;
    local_78[5] = 1.0;
    local_78[6] = 0.0;
    local_78[7] = 0.0;
    local_78[8] = 0.0;
    local_78[9] = 0.0;
    uStack_48 = (uint)local_88 ^ 0x80000000;
    uStack_44 = (uint)((ulong)local_88 >> 0x20) ^ 0x80000000;
    local_78[10] = 1.0;
    local_78[0xb] = 0.0;
    uVar2 = local_98 >> 0x20;
    uVar3 = local_b8._4_4_;
    local_88._0_4_ = uStack_b0._4_4_;
    uVar5 = uStack_90._4_4_;
    local_b8._4_4_ = (undefined4)local_a8;
    uStack_b0 = local_98 & 0xffffffff;
    local_40 = (uint)uStack_80 ^ 0x80000000;
    local_a8._0_4_ = uVar3;
    local_98._0_4_ = (undefined4)uVar4;
    local_98._4_4_ = (undefined4)uStack_a0;
    uStack_90 = uStack_90 & 0xffffffff;
    local_3c = 0x3f800000;
    local_88._4_4_ = uStack_a0._4_4_;
    uStack_80._0_4_ = uVar5;
    uStack_a0 = uVar2;
    multiply((float *)&local_b8,local_78);
    uVar2 = uStack_b0;
    uVar3 = local_b8._4_4_;
    uVar6 = (undefined4)uStack_a0;
    uVar5 = uStack_b0._4_4_;
    uVar7 = uStack_a0._4_4_;
    uVar8 = uStack_90._4_4_;
    local_b8 = CONCAT44((undefined4)local_a8,(float)local_b8);
    uStack_b0 = CONCAT44((undefined4)local_88,(undefined4)local_98);
    local_a8 = CONCAT44(local_a8._4_4_,uVar3);
    uStack_a0 = CONCAT44(local_88._4_4_,local_98._4_4_);
    local_98 = CONCAT44(uVar6,(int)uVar2);
    uStack_90 = CONCAT44((uint)uStack_80,(undefined4)uStack_90);
    local_88 = CONCAT44(uVar7,uVar5);
    uStack_80 = CONCAT44(uStack_80._4_4_,uVar8);
    iVar9 = (*gears->glGetUniformLocation)(gears->program,"u_NormalMatrix");
    (*gears->glUniformMatrix4fv)(iVar9,1,'\0',(GLfloat *)&local_b8);
    iVar9 = (*gears->glGetUniformLocation)(gears->program,"u_Color");
    (*gears->glUniform4fv)(iVar9,1,color);
    iVar9 = (*gears->glGetUniformLocation)(gears->program,"u_TextureEnable");
    pcVar10 = getenv("NO_TEXTURE");
    (*gears->glUniform1i)(iVar9,(uint)(pcVar10 == (char *)0x0));
    (*gears->glBindBuffer)(0x8892,pgVar1->vbo);
    (*gears->glVertexAttribPointer)(0,3,0x1406,'\0',0x20,(GLvoid *)0x0);
    (*gears->glVertexAttribPointer)(1,3,0x1406,'\0',0x20,(GLvoid *)0xc);
    (*gears->glVertexAttribPointer)(2,2,0x1406,'\0',0x20,(GLvoid *)0x18);
    (*gears->glEnableVertexAttribArray)(0);
    (*gears->glEnableVertexAttribArray)(1);
    (*gears->glEnableVertexAttribArray)(2);
    for (lVar11 = 0; lVar11 < pgVar1->nstrips; lVar11 = lVar11 + 1) {
      (*gears->glDrawArrays)(5,pgVar1->strips[lVar11].begin,pgVar1->strips[lVar11].count);
    }
    (*gears->glDisableVertexAttribArray)(2);
    (*gears->glDisableVertexAttribArray)(1);
    (*gears->glDisableVertexAttribArray)(0);
  }
  return;
}

Assistant:

static void draw_gear(gears_t *gears, int id, float model_tx, float model_ty, float model_rz, const float *color)
{
  struct gear *gear = gears->gear[id];
  const float pos[4] = { 5.0, 5.0, 10.0, 0.0 };
  float ModelView[16], ModelViewProjection[16];
  GLint LightPos_loc, ModelViewProjection_loc, Normal_loc, Color_loc, TextureEnable_loc;
  int k;

  if (!gear) {
    return;
  }

  LightPos_loc = gears->glGetUniformLocation(gears->program, "u_LightPos");
  gears->glUniform4fv(LightPos_loc, 1, pos);

  memcpy(ModelView, gears->View, sizeof(ModelView));

  translate(ModelView, model_tx, model_ty, 0);
  rotate(ModelView, model_rz, 0, 0, 1);

  memcpy(ModelViewProjection, gears->Projection, sizeof(ModelViewProjection));
  multiply(ModelViewProjection, ModelView);
  ModelViewProjection_loc = gears->glGetUniformLocation(gears->program, "u_ModelViewProjectionMatrix");
  gears->glUniformMatrix4fv(ModelViewProjection_loc, 1, GL_FALSE, ModelViewProjection);

  invert(ModelView);
  transpose(ModelView);
  Normal_loc = gears->glGetUniformLocation(gears->program, "u_NormalMatrix");
  gears->glUniformMatrix4fv(Normal_loc, 1, GL_FALSE, ModelView);

  Color_loc = gears->glGetUniformLocation(gears->program, "u_Color");
  gears->glUniform4fv(Color_loc, 1, color);

  TextureEnable_loc = gears->glGetUniformLocation(gears->program, "u_TextureEnable");
  if (getenv("NO_TEXTURE"))
    gears->glUniform1i(TextureEnable_loc, 0);
  else
    gears->glUniform1i(TextureEnable_loc, 1);

  gears->glBindBuffer(GL_ARRAY_BUFFER, gear->vbo);

  gears->glVertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE, sizeof(Vertex), NULL);
  gears->glVertexAttribPointer(1, 3, GL_FLOAT, GL_FALSE, sizeof(Vertex), (const float *)NULL + 3);
  gears->glVertexAttribPointer(2, 2, GL_FLOAT, GL_FALSE, sizeof(Vertex), (const float *)NULL + 6);

  gears->glEnableVertexAttribArray(0);
  gears->glEnableVertexAttribArray(1);
  gears->glEnableVertexAttribArray(2);

  for (k = 0; k < gear->nstrips; k++) {
    gears->glDrawArrays(GL_TRIANGLE_STRIP, gear->strips[k].begin, gear->strips[k].count);
  }

  gears->glDisableVertexAttribArray(2);
  gears->glDisableVertexAttribArray(1);
  gears->glDisableVertexAttribArray(0);
}